

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

int fiorfda(osfildef *fp,vocddef *p,uint cnt)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  uint in_EDX;
  undefined2 *in_RSI;
  FILE *in_RDI;
  uchar buf [14];
  uint i;
  vocddef *q;
  undefined1 local_3a [2];
  undefined1 local_38 [2];
  undefined1 local_36;
  undefined1 auStack_35 [4];
  undefined1 auStack_31 [2];
  undefined1 auStack_2f [3];
  uint local_2c;
  undefined2 *local_28;
  undefined2 *local_18;
  FILE *local_10;
  
  local_28 = in_RSI;
  for (local_2c = 0; local_18 = in_RSI, local_10 = in_RDI, local_2c < in_EDX;
      local_2c = local_2c + 1) {
    *local_28 = 0xffff;
    local_28 = local_28 + 0x10;
  }
  while( true ) {
    sVar2 = fread(local_3a,0xd,1,local_10);
    if (sVar2 != 1) {
      return 1;
    }
    local_2c = osrp2(local_3a);
    if (local_2c == 0xffff) break;
    local_28 = local_18 + (ulong)local_2c * 0x10;
    iVar1 = osrp2(local_38);
    *local_28 = (short)iVar1;
    *(undefined1 *)(local_28 + 4) = local_36;
    switch(local_36) {
    case 1:
      lVar3 = osrp4s(auStack_35);
      *(long *)(local_28 + 8) = lVar3;
      break;
    case 2:
    case 10:
      iVar1 = osrp2(auStack_35);
      local_28[8] = (short)iVar1;
      break;
    case 0xd:
      iVar1 = osrp2(auStack_35);
      local_28[8] = (short)iVar1;
    }
    iVar1 = osrp2(auStack_31);
    local_28[0xc] = (short)iVar1;
    iVar1 = osrp2(auStack_2f);
    *(int *)(local_28 + 0xe) = iVar1;
  }
  return 0;
}

Assistant:

static int fiorfda(osfildef *fp, vocddef *p, uint cnt)
{
    vocddef *q;
    uint     i;
    uchar    buf[14];
    
    /* start by clearing out entire record */
    for (i = 0, q = p ; i < cnt ; ++q, ++i)
        q->vocdfn = MCMONINV;
    
    /* now restore all the records from the file */
    for (;;)
    {
        /* read a record, and quit if it's the last one */
        if (osfrb(fp, buf, 13)) return(TRUE);
        if ((i = osrp2(buf)) == 0xffff) return(FALSE);
        
        /* restore this record */
        q = p + i;
        q->vocdfn = osrp2(buf+2);
        q->vocdarg.runstyp = buf[4];
        switch(buf[4])
        {
        case DAT_NUMBER:
            q->vocdarg.runsv.runsvnum = osrp4s(buf+5);
            break;
        case DAT_OBJECT:
        case DAT_FNADDR:
            q->vocdarg.runsv.runsvobj = osrp2(buf+5);
            break;
        case DAT_PROPNUM:
            q->vocdarg.runsv.runsvprp = osrp2(buf+5);
            break;
        }
        q->vocdprp = osrp2(buf+9);
        q->vocdtim = osrp2(buf+11);
    }
}